

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O0

void __thiscall
uWS::WebSocketHandshake::static_for<14,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()
          (static_for<14,_uWS::WebSocketHandshake::Sha1Loop<1>_> *this,uint32_t *a,uint32_t *b)

{
  uint32_t *in_RDX;
  static_for<13,_uWS::WebSocketHandshake::Sha1Loop<1>_> *in_RSI;
  uint32_t *in_stack_ffffffffffffffd8;
  uint32_t *in_stack_ffffffffffffffe0;
  
  static_for<13,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  Sha1Loop<1>::f<13>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }